

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O3

void __thiscall HModel::initCost(HModel *this,int perturb)

{
  int iVar1;
  int iVar2;
  pointer pdVar3;
  pointer pdVar4;
  pointer pdVar5;
  pointer pdVar6;
  long lVar7;
  int var;
  long lVar8;
  long lVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  
  iVar1 = this->numCol;
  lVar7 = (long)iVar1;
  if (0 < lVar7) {
    iVar2 = this->objSense;
    pdVar3 = (this->colCost).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar4 = (this->workCost).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar5 = (this->workShift).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar8 = 0;
    do {
      pdVar4[lVar8] = pdVar3[lVar8] * (double)iVar2;
      pdVar5[lVar8] = 0.0;
      lVar8 = lVar8 + 1;
    } while (lVar7 != lVar8);
  }
  iVar2 = this->numRow;
  if (0 < (long)iVar2) {
    pdVar3 = (this->workShift).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar4 = (this->workCost).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar8 = 0;
    do {
      pdVar4[lVar7 + lVar8] = 0.0;
      pdVar3[lVar7 + lVar8] = 0.0;
      lVar8 = lVar8 + 1;
    } while (iVar2 != lVar8);
  }
  this->problemPerturbed = 0;
  if ((perturb != 0) && (this->intOption[5] != 0)) {
    this->problemPerturbed = 1;
    dVar10 = 0.0;
    if (0 < iVar1) {
      lVar8 = 0;
      dVar12 = dVar10;
      do {
        dVar10 = ABS((this->workCost).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar8]);
        if (dVar10 <= dVar12) {
          dVar10 = dVar12;
        }
        lVar8 = lVar8 + 1;
        dVar12 = dVar10;
      } while (lVar7 != lVar8);
      if (100.0 < dVar10) {
        if (dVar10 < 0.0) {
          dVar10 = sqrt(dVar10);
        }
        else {
          dVar10 = SQRT(dVar10);
        }
        if (dVar10 < 0.0) {
          dVar10 = sqrt(dVar10);
        }
        else {
          dVar10 = SQRT(dVar10);
        }
      }
    }
    dVar12 = 0.0;
    iVar1 = this->numTot;
    lVar7 = (long)iVar1;
    if (0 < lVar7) {
      dVar12 = 0.0;
      lVar8 = 0;
      do {
        dVar12 = dVar12 + (double)(-(ulong)((this->workRange).
                                            super__Vector_base<double,_std::allocator<double>_>.
                                            _M_impl.super__Vector_impl_data._M_start[lVar8] < 1e+30)
                                  & 0x3ff0000000000000);
        lVar8 = lVar8 + 1;
      } while (lVar7 != lVar8);
    }
    dVar11 = 5e-07;
    if (0.01 <= dVar12 / (double)iVar1 || dVar10 <= 1.0) {
      dVar11 = dVar10 * 5e-07;
    }
    iVar2 = this->numCol;
    lVar8 = (long)iVar2;
    if (0 < lVar8) {
      pdVar3 = (this->colLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar4 = (this->colUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar5 = (this->workCost).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar6 = (this->dblXpert).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar9 = 0;
      do {
        dVar10 = pdVar3[lVar9];
        dVar12 = pdVar4[lVar9];
        dVar13 = pdVar5[lVar9];
        if ((((dVar10 != -1e+200) || (NAN(dVar10))) || (dVar12 != 1e+200)) || (NAN(dVar12))) {
          dVar14 = (ABS(dVar13) + 1.0) * dVar11 * (pdVar6[lVar9] + 1.0);
          if ((dVar12 != 1e+200) || (NAN(dVar12))) {
            if ((dVar10 != -1e+200) || (NAN(dVar10))) {
              if ((dVar10 == dVar12) && (!NAN(dVar10) && !NAN(dVar12))) goto LAB_00129f0c;
              dVar13 = dVar13 + (double)(~-(ulong)(0.0 <= dVar13) & (ulong)-dVar14 |
                                        -(ulong)(0.0 <= dVar13) & (ulong)dVar14);
            }
            else {
              dVar13 = dVar13 - dVar14;
            }
          }
          else {
            dVar13 = dVar13 + dVar14;
          }
          pdVar5[lVar9] = dVar13;
        }
LAB_00129f0c:
        lVar9 = lVar9 + 1;
      } while (lVar8 != lVar9);
    }
    if (iVar2 < iVar1) {
      pdVar3 = (this->workCost).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar4 = (this->dblXpert).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      do {
        pdVar3[lVar8] = (0.5 - pdVar4[lVar8]) * 1e-12 + pdVar3[lVar8];
        lVar8 = lVar8 + 1;
      } while (lVar7 != lVar8);
    }
  }
  return;
}

Assistant:

void HModel::initCost(int perturb) {
  // Copy the cost
  initPh2ColCost(0, numCol-1);
  initPh2RowCost(0, numRow-1);
  // See if we want to skip perturbation
  problemPerturbed = 0;
  if (perturb == 0 || intOption[INTOPT_PERTURB_FLAG] == 0) return;
  problemPerturbed = 1;

  // Perturb the original costs, scale down if is too big
  double bigc = 0;
  for (int i = 0; i < numCol; i++)
    bigc = max(bigc, fabs(workCost[i]));
  if (bigc > 100)
    bigc = sqrt(sqrt(bigc));
  
  // If there's few boxed variables, we will just use Simple perturbation
  double boxedRate = 0;
  for (int i = 0; i < numTot; i++)
    boxedRate += (workRange[i] < 1e30);
  boxedRate /= numTot;
  if (boxedRate < 0.01)
    bigc = min(bigc, 1.0);
  if (bigc < 1) {
    //        bigc = sqrt(bigc);
  }
  
  // Determine the perturbation base
  double base = 5e-7 * bigc;
  
  // Now do the perturbation
  for (int i = 0; i < numCol; i++) {
    double lower = colLower[i];
    double upper = colUpper[i];
    double xpert = (fabs(workCost[i]) + 1) * base * (1 + dblXpert[i]);
    if (lower == -HSOL_CONST_INF && upper == HSOL_CONST_INF) {
      // Free - no perturb
    } else if (upper == HSOL_CONST_INF) {  // Lower
      workCost[i] += xpert;
    } else if (lower == -HSOL_CONST_INF) { // Upper
      workCost[i] += -xpert;
    } else if (lower != upper) {  // Boxed
      workCost[i] += (workCost[i] >= 0) ? xpert : -xpert;
    } else {
      // Fixed - no perturb
    }
  }
  
  for (int i = numCol; i < numTot; i++) {
    workCost[i] += (0.5 - dblXpert[i]) * 1e-12;
  }
  
}